

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDEdge::RemoveFaceFromArray(ON_SubDEdge *this,ON_SubDFace *f)

{
  ushort uVar1;
  ON_SubDFacePtr *pOVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  if (f == (ON_SubDFace *)0x0) {
    return false;
  }
  uVar1 = this->m_face_count;
  uVar6 = (ulong)uVar1;
  uVar8 = (uint)uVar1;
  if (uVar6 < 3) {
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        if ((ON_SubDFace *)(this->m_face2[uVar5].m_ptr & 0xfffffffffffffff8) == f) {
          if ((int)uVar5 + 1U < uVar8) {
            this->m_face2[uVar5].m_ptr = this->m_face2[uVar5 + 1].m_ptr;
          }
LAB_005cd092:
          this->m_face_count = uVar1 - 1;
          return true;
        }
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
  else {
    lVar7 = 0;
    bVar4 = true;
    do {
      bVar3 = bVar4;
      if ((ON_SubDFace *)(this->m_face2[lVar7].m_ptr & 0xfffffffffffffff8) == f) {
        if (bVar3) {
          this->m_face2[0].m_ptr = this->m_face2[1].m_ptr;
        }
        pOVar2 = this->m_facex;
        this->m_face2[1].m_ptr = pOVar2->m_ptr;
        if (uVar8 != 3) {
          uVar6 = 4;
          if (4 < uVar1) {
            uVar6 = (ulong)uVar8;
          }
          memmove(pOVar2,pOVar2 + 1,uVar6 * 8 + 0x7ffffffe8 & 0x7fffffff8);
        }
        goto LAB_005cd092;
      }
      lVar7 = 1;
      bVar4 = false;
    } while (bVar3);
    pOVar2 = this->m_facex;
    lVar7 = 0;
    do {
      if ((ON_SubDFace *)(pOVar2[lVar7].m_ptr & 0xfffffffffffffff8) == f) {
        if ((int)lVar7 + 3U < uVar8) {
          do {
            pOVar2[lVar7].m_ptr = pOVar2[lVar7 + 1].m_ptr;
            lVar7 = lVar7 + 1;
          } while ((ulong)(uVar1 - 1) - 2 != lVar7);
        }
        goto LAB_005cd092;
      }
      lVar7 = lVar7 + 1;
    } while (uVar6 - 2 != lVar7);
  }
  return false;
}

Assistant:

bool ON_SubDEdge::RemoveFaceFromArray(
  const ON_SubDFace* f
  )
{
  unsigned int i;
  if (nullptr == f)
    return false;

  if (m_face_count <= 2)
  {
    for (i = 0; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_face2[i - 1] = m_face2[i];
        m_face_count--;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 2; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < 2; i++)
          m_face2[i - 1] = m_face2[i];
        m_face2[1] = m_facex[0];
        for (i = 3; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
    for (i = 2; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_facex[i - 2].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
  }

  return false;
}